

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mid2svg.cpp
# Opt level: O0

void drawHexThin(ostream *out,double x,double y,double width,double height)

{
  ostream *poVar1;
  double *w;
  double *h;
  double height_local;
  double width_local;
  double y_local;
  double x_local;
  ostream *out_local;
  
  std::operator<<(out,"\t\t\t\t<path vector-effect=\"non-scaling-stroke\" d=\"");
  poVar1 = std::operator<<(out,"M ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y + height / 3.0);
  poVar1 = std::operator<<(out," L ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y + (height * 2.0) / 3.0);
  poVar1 = std::operator<<(out," L ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x + width / 2.0);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y + height);
  poVar1 = std::operator<<(out," L ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x + width);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y + (height * 2.0) / 3.0);
  poVar1 = std::operator<<(out," L ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x + width);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y + height / 3.0);
  poVar1 = std::operator<<(out," L ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x + width / 2.0);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y);
  std::operator<<(out," z\"");
  std::operator<<(out,"/>\n");
  return;
}

Assistant:

void drawHexThin(ostream& out, double x, double y, double width,
		double height) {
	double& h = height;
	double& w = width;
	out << "\t\t\t\t<path vector-effect=\"non-scaling-stroke\" d=\"";
	out << "M "  << x           << " " << y+h/3.0;
	out << " L " << x           << " " << y+h*2.0/3.0;
	out << " L " << x+w/2.0     << " " << y+h;
	out << " L " << x+w         << " " << y+h*2.0/3.0;
	out << " L " << x+w         << " " << y+h/3.0;
	out << " L " << x+w/2.0     << " " << y;
	out << " z\"";
	out << "/>\n";
}